

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

cf_size_t cf_str_count_for(cf_char_t *s,cf_char_t c)

{
  cf_size_t cVar1;
  
  if (s == (cf_char_t *)0x0) {
    cVar1 = 0;
  }
  else {
    if (c == '\0') {
      return 1;
    }
    cVar1 = 0;
    for (; *s != '\0'; s = s + 1) {
      cVar1 = cVar1 + (*s == c);
    }
  }
  return cVar1;
}

Assistant:

cf_size_t cf_str_count_for(cf_char_t* s, cf_char_t c) {
    cf_size_t cnt = 0;

    if (!s) return 0;
    if (c == '\0') return 1;

    while (*s != '\0') {
        if (*s == c) cnt ++;
        s++;
    }
    return cnt;
}